

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericsort.c
# Opt level: O0

int numericsort(dirent **A,dirent **B,int cs)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  int local_4c;
  int local_44;
  int magdiff;
  int diff;
  int ret;
  char *b;
  char *a;
  int cs_local;
  dirent **B_local;
  dirent **A_local;
  
  b = (*A)->d_name;
  _diff = (*B)->d_name;
  while( true ) {
    while ((ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)(byte)*b] & 0x800) == 0 ||
           (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)(byte)*_diff] & 0x800) == 0))) {
      if (cs == 0) {
        iVar1 = tolower((uint)(byte)*b);
        iVar2 = tolower((uint)(byte)*_diff);
        magdiff = iVar1 - iVar2;
      }
      else {
        magdiff = (int)*b - (int)*_diff;
      }
      if ((magdiff != 0) || (*b == '\0')) goto LAB_001f5cb4;
      b = b + 1;
      _diff = _diff + 1;
    }
    for (; *b == '0'; b = b + 1) {
    }
    for (; *_diff == 0x30; _diff = _diff + 1) {
    }
    while( true ) {
      ppuVar3 = __ctype_b_loc();
      bVar4 = false;
      if (((*ppuVar3)[(int)(uint)(byte)*b] & 0x800) != 0) {
        bVar4 = *b == *_diff;
      }
      if (!bVar4) break;
      b = b + 1;
      _diff = _diff + 1;
    }
    ppuVar3 = __ctype_b_loc();
    if ((((*ppuVar3)[(int)(uint)(byte)*b] & 0x800) == 0) ||
       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)(byte)*_diff] & 0x800) == 0)) {
      local_4c = 0;
    }
    else {
      local_4c = (int)*b - (int)*_diff;
    }
    local_44 = 0;
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)(byte)*b] & 0x800) != 0) {
      local_44 = local_44 + 1;
      b = b + 1;
    }
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)(byte)*_diff] & 0x800) != 0) {
      local_44 = local_44 + -1;
      _diff = _diff + 1;
    }
    if (local_44 != 0) break;
    if (local_4c != 0) {
      magdiff = local_4c;
LAB_001f5cb4:
      if (magdiff == 0) {
        A_local._4_4_ = 0;
      }
      else {
        A_local._4_4_ = 1;
        if (magdiff < 0) {
          A_local._4_4_ = -1;
        }
      }
      return A_local._4_4_;
    }
  }
  magdiff = local_44;
  goto LAB_001f5cb4;
}

Assistant:

static int numericsort(struct dirent **A, struct dirent **B, int cs) {
  const char* a = (*A)->d_name;
  const char* b = (*B)->d_name;
  int ret = 0;
  for (;;) {
    if (isdigit(*a & 255) && isdigit(*b & 255)) {
      int diff,magdiff;
      while (*a == '0') a++;
      while (*b == '0') b++;
      while (isdigit(*a & 255) && *a == *b) {a++; b++;}
      diff = (isdigit(*a & 255) && isdigit(*b & 255)) ? *a - *b : 0;
      magdiff = 0;
      while (isdigit(*a & 255)) {magdiff++; a++;}
      while (isdigit(*b & 255)) {magdiff--; b++;}
      if (magdiff) {ret = magdiff; break;} /* compare # of significant digits*/
      if (diff) {ret = diff; break;}	/* compare first non-zero digit */
    } else {
      if (cs) {
      	/* compare case-sensitive */
	if ((ret = *a-*b)) break;
      } else {
	/* compare case-insensitve */
	if ((ret = tolower(*a & 255)-tolower(*b & 255))) break;
      }

      if (!*a) break;
      a++; b++;
    }
  }
  if (!ret) return 0;
  else return (ret < 0) ? -1 : 1;
}